

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

int secp256k1_musig_aggnonce_parse
              (secp256k1_context *ctx,secp256k1_musig_aggnonce *nonce,uchar *in66)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  char *pcVar4;
  secp256k1_ge *elem;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8;
  secp256k1_ge ges [2];
  
  if (nonce == (secp256k1_musig_aggnonce *)0x0) {
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "nonce != NULL";
  }
  else {
    if (in66 != (uchar *)0x0) {
      lVar2 = 0;
      do {
        if (lVar2 == 0xb0) {
          secp256k1_musig_aggnonce_save(nonce,ges);
          return 1;
        }
        elem = (secp256k1_ge *)((long)ges[0].x.n + lVar2);
        local_108 = 0;
        uStack_100 = 0;
        local_118 = 0;
        uStack_110 = 0;
        local_f8 = 0;
        iVar1 = secp256k1_memcmp_var(in66,&local_118,0x21);
        if (iVar1 == 0) {
          *(undefined4 *)((long)(&ges[0].y + 1) + lVar2) = 1;
          *(undefined8 *)((long)ges[0].y.n + lVar2 + 0x18) = 0;
          *(undefined8 *)((long)ges[0].y.n + lVar2 + 0x20) = 0;
          *(undefined8 *)((long)ges[0].y.n + lVar2 + 8) = 0;
          *(undefined8 *)((long)ges[0].y.n + lVar2 + 0x10) = 0;
          *(undefined8 *)((long)ges[0].x.n + lVar2 + 0x20) = 0;
          *(undefined8 *)((long)ges[0].y.n + lVar2) = 0;
          *(undefined8 *)((long)ges[0].x.n + lVar2 + 0x10) = 0;
          *(undefined8 *)((long)ges[0].x.n + lVar2 + 0x18) = 0;
          (elem->x).n[0] = 0;
          *(undefined8 *)((long)ges[0].x.n + lVar2 + 8) = 0;
        }
        else {
          iVar1 = secp256k1_eckey_pubkey_parse(elem,in66,0x21);
          if (iVar1 == 0) {
            return 0;
          }
        }
        lVar2 = lVar2 + 0x58;
        in66 = in66 + 0x21;
      } while( true );
    }
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "in66 != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar4,pvVar3);
  return 0;
}

Assistant:

int secp256k1_musig_aggnonce_parse(const secp256k1_context* ctx, secp256k1_musig_aggnonce* nonce, const unsigned char *in66) {
    secp256k1_ge ges[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(nonce != NULL);
    ARG_CHECK(in66 != NULL);

    for (i = 0; i < 2; i++) {
        if (!secp256k1_musig_ge_parse_ext(&ges[i], &in66[33*i])) {
            return 0;
        }
    }
    secp256k1_musig_aggnonce_save(nonce, ges);
    return 1;
}